

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  value_type line;
  value_type vVar7;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff818;
  int in_stack_fffffffffffff81c;
  undefined7 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff827;
  undefined4 in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff82c;
  undefined4 in_stack_fffffffffffff830;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff834;
  undefined2 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff83a;
  undefined1 in_stack_fffffffffffff83b;
  int in_stack_fffffffffffff83c;
  undefined4 in_stack_fffffffffffff840;
  undefined4 uVar9;
  undefined1 in_stack_fffffffffffff844;
  undefined1 in_stack_fffffffffffff845;
  undefined1 in_stack_fffffffffffff846;
  undefined1 in_stack_fffffffffffff847;
  undefined4 in_stack_fffffffffffff84c;
  Type TVar10;
  char *in_stack_fffffffffffff880;
  char *in_stack_fffffffffffff888;
  char *in_stack_fffffffffffff890;
  AssertionResult *in_stack_fffffffffffff898;
  AssertHelper *in_stack_fffffffffffff8a0;
  AssertionResult local_748 [6];
  value_type local_6e0;
  int local_6dc;
  value_type *in_stack_fffffffffffff958;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff960;
  int local_67c;
  string local_678 [55];
  undefined1 local_641;
  AssertionResult local_640 [6];
  value_type local_5d4;
  string local_5d0 [55];
  byte local_599;
  AssertionResult local_598;
  string local_588 [55];
  undefined1 local_551;
  AssertionResult local_550 [6];
  value_type local_4e4;
  string local_4e0 [55];
  byte local_4a9;
  AssertionResult local_4a8;
  string local_498 [55];
  undefined1 local_461;
  AssertionResult local_460 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3b8 [2];
  string local_398 [55];
  undefined1 local_361;
  AssertionResult local_360;
  string local_350 [55];
  byte local_319;
  AssertionResult local_318;
  string local_308 [55];
  undefined1 local_2d1;
  AssertionResult local_2d0;
  key_type local_2bc;
  string local_2b8 [55];
  byte local_281;
  AssertionResult local_280;
  string local_270 [55];
  undefined1 local_239;
  AssertionResult local_238;
  string local_228 [55];
  byte local_1f1;
  AssertionResult local_1f0;
  string local_1e0 [55];
  undefined1 local_1a9;
  AssertionResult local_1a8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_198 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8 [12];
  
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             in_stack_fffffffffffff81c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             in_stack_fffffffffffff81c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_c8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffff847,
                         CONCAT16(in_stack_fffffffffffff846,
                                  CONCAT15(in_stack_fffffffffffff845,
                                           CONCAT14(in_stack_fffffffffffff844,
                                                    in_stack_fffffffffffff840)))),
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             (hasher *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             (key_equal *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
             (allocator_type *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_c8);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             in_stack_fffffffffffff81c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             in_stack_fffffffffffff81c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_198,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffff847,
                         CONCAT16(in_stack_fffffffffffff846,
                                  CONCAT15(in_stack_fffffffffffff845,
                                           CONCAT14(in_stack_fffffffffffff844,
                                                    in_stack_fffffffffffff840)))),
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             (hasher *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             (key_equal *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
             (allocator_type *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_198);
  local_1a9 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                           (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  TVar10 = CONCAT13(local_1a9,(int3)in_stack_fffffffffffff84c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee1aa0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(in_stack_fffffffffffff847,
                                CONCAT16(in_stack_fffffffffffff846,
                                         CONCAT15(in_stack_fffffffffffff845,
                                                  CONCAT14(in_stack_fffffffffffff844,
                                                           in_stack_fffffffffffff840)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_1e0);
    testing::Message::~Message((Message *)0xee1be4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee1c78);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  TVar10 = CONCAT13((char)(TVar10 >> 0x18),CONCAT12(bVar1,(short)TVar10));
  local_1f1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee1cb6)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(in_stack_fffffffffffff847,
                                CONCAT16(in_stack_fffffffffffff846,
                                         CONCAT15(in_stack_fffffffffffff845,
                                                  CONCAT14(in_stack_fffffffffffff844,
                                                           in_stack_fffffffffffff840)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_228);
    testing::Message::~Message((Message *)0xee1d8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee1e1f);
  local_239 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                           (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  TVar10 = CONCAT22((short)(TVar10 >> 0x10),CONCAT11(local_239,(char)TVar10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee1e60)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(in_stack_fffffffffffff847,
                                CONCAT16(in_stack_fffffffffffff846,
                                         CONCAT15(in_stack_fffffffffffff845,
                                                  CONCAT14(in_stack_fffffffffffff844,
                                                           in_stack_fffffffffffff840)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_270);
    testing::Message::~Message((Message *)0xee1f35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee1fc9);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  TVar10 = CONCAT31((int3)(TVar10 >> 8),bVar1);
  local_281 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee200c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(in_stack_fffffffffffff847,
                                CONCAT16(in_stack_fffffffffffff846,
                                         CONCAT15(in_stack_fffffffffffff845,
                                                  CONCAT14(in_stack_fffffffffffff844,
                                                           in_stack_fffffffffffff840)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_2b8);
    testing::Message::~Message((Message *)0xee20e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee2178);
  local_2bc = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                          in_stack_fffffffffffff81c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                    (key_type *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  uVar2 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  local_2d1 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee21f0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff846,
                                               CONCAT15(in_stack_fffffffffffff845,
                                                        CONCAT14(in_stack_fffffffffffff844,
                                                                 in_stack_fffffffffffff840)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_308);
    testing::Message::~Message((Message *)0xee22c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee2359);
  uVar3 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  local_319 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee239c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff845,
                                                              CONCAT14(in_stack_fffffffffffff844,
                                                                       in_stack_fffffffffffff840))))
               ,in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_350);
    testing::Message::~Message((Message *)0xee2471);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee2505);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
           CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  uVar4 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  local_361 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee255a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffff844,
                                                  in_stack_fffffffffffff840)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_398);
    testing::Message::~Message((Message *)0xee262f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee26c6);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             in_stack_fffffffffffff81c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_3b8,2,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff844,
                                                                      in_stack_fffffffffffff840)))),
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             (hasher *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             (key_equal *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
             (allocator_type *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
  uVar5 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  local_461 = uVar5;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee275a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff840)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_498);
    testing::Message::~Message((Message *)0xee2861);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee28f5);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff840);
  local_4a9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee2938)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar9)))),
               in_stack_fffffffffffff83c,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_4e0);
    testing::Message::~Message((Message *)0xee2a0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee2aa4);
  line = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                        in_stack_fffffffffffff81c);
  local_4e4 = line;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_551 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator!=((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                           (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee2b24)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar9)))),line,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_588);
    testing::Message::~Message((Message *)0xee2bf9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee2c8d);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  local_599 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee2cd0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar9)))),line,
               (char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_5d0);
    testing::Message::~Message((Message *)0xee2da5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee2e3c);
  vVar7 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                         in_stack_fffffffffffff81c);
  local_5d4 = vVar7;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_641 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                           (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  uVar8 = CONCAT13(local_641,(int3)in_stack_fffffffffffff830);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee2ebc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_640);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar9)))),line,
               (char *)CONCAT44(vVar7,uVar8));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    std::__cxx11::string::~string(local_678);
    testing::Message::~Message((Message *)0xee2f91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee3025);
  for (local_67c = 3; local_67c < 0x7d1; local_67c = local_67c + 1) {
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   in_stack_fffffffffffff81c);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  }
  for (local_6dc = 2000; 2 < local_6dc; local_6dc = local_6dc + -1) {
    local_6e0 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                               in_stack_fffffffffffff81c);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  }
  uVar6 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                       (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(uVar6,in_stack_fffffffffffff820),
             (bool *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),(type *)0xee3151)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_748);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,TVar10,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar9)))),line,
               (char *)CONCAT44(vVar7,uVar8));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffff820));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff880);
    testing::Message::~Message((Message *)0xee320b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee3299);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee32a6);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3b8);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee32c0);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee32cd);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}